

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Appearance_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::Appearance_PDU::SetEntityMarking(Appearance_PDU *this,EntityMarking *EM)

{
  KUINT16 *pKVar1;
  KUINT8 KVar2;
  KCHAR8 KVar3;
  KCHAR8 KVar4;
  KCHAR8 KVar5;
  KCHAR8 KVar6;
  KCHAR8 KVar7;
  KCHAR8 KVar8;
  KCHAR8 KVar9;
  
  if (((this->m_AppearanceFlag1Union).m_ui8Flag & 8) == 0) {
    (this->m_AppearanceFlag1Union).m_ui8Flag = (this->m_AppearanceFlag1Union).m_ui8Flag | 8;
    pKVar1 = &(this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + 0xc;
  }
  KVar2 = EM->m_ui8EntityMarkingCharacterSet;
  KVar3 = EM->m_sEntityMarkingString[0];
  KVar4 = EM->m_sEntityMarkingString[1];
  KVar5 = EM->m_sEntityMarkingString[2];
  KVar6 = EM->m_sEntityMarkingString[3];
  KVar7 = EM->m_sEntityMarkingString[4];
  KVar8 = EM->m_sEntityMarkingString[5];
  KVar9 = EM->m_sEntityMarkingString[6];
  *(undefined8 *)((this->m_EntityMarking).m_sEntityMarkingString + 4) =
       *(undefined8 *)(EM->m_sEntityMarkingString + 4);
  (this->m_EntityMarking).m_ui8EntityMarkingCharacterSet = KVar2;
  (this->m_EntityMarking).m_sEntityMarkingString[0] = KVar3;
  (this->m_EntityMarking).m_sEntityMarkingString[1] = KVar4;
  (this->m_EntityMarking).m_sEntityMarkingString[2] = KVar5;
  (this->m_EntityMarking).m_sEntityMarkingString[3] = KVar6;
  (this->m_EntityMarking).m_sEntityMarkingString[4] = KVar7;
  (this->m_EntityMarking).m_sEntityMarkingString[5] = KVar8;
  (this->m_EntityMarking).m_sEntityMarkingString[6] = KVar9;
  return;
}

Assistant:

void Appearance_PDU::SetEntityMarkingFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_AppearanceFlag1Union.m_ui8Mark )return;

    m_AppearanceFlag1Union.m_ui8Mark = F;

    if( F )
    {
        m_ui16PDULength += EntityMarking::ENTITY_MARKING_SIZE;
    }
    else
    {
        m_ui16PDULength -= EntityMarking::ENTITY_MARKING_SIZE;
    }
}